

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digraph.h
# Opt level: O3

bool __thiscall DegreeComp::operator()(DegreeComp *this,VertexIdx u,VertexIdx v)

{
  EdgeIdx *pEVar1;
  
  if (-1 < (v | u)) {
    pEVar1 = this->g->offsets;
    return pEVar1[u + 1] - pEVar1[u] < pEVar1[v + 1] - pEVar1[v] ||
           u < v && pEVar1[u + 1] - pEVar1[u] == pEVar1[v + 1] - pEVar1[v];
  }
  printf("Something wrong in DegreeComp, negative vertices. u is %lld, v is %lld\n");
  exit(1);
}

Assistant:

bool operator()(VertexIdx u, VertexIdx v) {
        if (u < 0 || v < 0) // something wrong, so print error message, and exit
        {
            printf("Something wrong in DegreeComp, negative vertices. u is %lld, v is %lld\n", u, v);
            exit(EXIT_FAILURE);
        }
        VertexIdx degu = g->offsets[u + 1] - g->offsets[u];  // Degree of u
        VertexIdx degv = g->offsets[v + 1] - g->offsets[v];  // Degree of v

        if (degu < degv || (degu == degv && u < v))    // Comparing degrees and breaking ties by id
            return true;
        else
            return false;
    }